

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputSource.cc
# Opt level: O3

bool __thiscall
InputSource::findLast
          (InputSource *this,char *start_chars,qpdf_offset_t offset,size_t len,Finder *finder)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  long i;
  long offset_00;
  
  bVar1 = findFirst(this,start_chars,offset,len,finder);
  if (bVar1) {
    bVar1 = false;
    do {
      if (!bVar1) {
        bVar1 = true;
      }
      iVar3 = (*this->_vptr_InputSource[4])(this);
      offset_00 = CONCAT44(extraout_var,iVar3);
      i = offset_00 - offset;
      if (i < 0) {
        QIntC::IntConverter<long_long,_unsigned_long,_true,_false>::error(i);
      }
      bVar2 = findFirst(this,start_chars,offset_00,len - i,finder);
    } while (bVar2);
    if (bVar1) {
      (*this->_vptr_InputSource[5])(this,offset_00,0);
      return true;
    }
  }
  return false;
}

Assistant:

bool
InputSource::findLast(char const* start_chars, qpdf_offset_t offset, size_t len, Finder& finder)
{
    bool found = false;
    qpdf_offset_t after_found_offset = 0;
    qpdf_offset_t cur_offset = offset;
    size_t cur_len = len;
    while (this->findFirst(start_chars, cur_offset, cur_len, finder)) {
        if (found) {
            QTC::TC("libtests", "InputSource findLast found more than one");
        } else {
            found = true;
        }
        after_found_offset = this->tell();
        cur_offset = after_found_offset;
        cur_len = len - QIntC::to_size((cur_offset - offset));
    }
    if (found) {
        this->seek(after_found_offset, SEEK_SET);
    }
    return found;
}